

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

regexp_flag mjs::regexp_flag_from_char(char ch)

{
  regexp_flag rVar1;
  
  rVar1 = none;
  if ((byte)(ch + 0x99U) < 7) {
    rVar1 = (&DAT_001a9cec)[(byte)(ch + 0x99U)];
  }
  return rVar1;
}

Assistant:

regexp_flag regexp_flag_from_char(char ch) {
    switch (ch) {
    case 'g': return regexp_flag::global;
    case 'i': return regexp_flag::ignore_case;
    case 'm': return regexp_flag::multiline;
    default:  return regexp_flag::none;
    }
}